

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::LoadToWallet(CWallet *this,uint256 *hash,UpdateWalletTxFn *fill_wtx)

{
  CWalletTx *this_00;
  key_type *pkVar1;
  bool bVar2;
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> _Var3;
  iterator iVar4;
  iterator iVar5;
  int64_t iVar6;
  CTxIn *txin;
  uchar *__k;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar7;
  undefined1 local_59;
  undefined1 local_58 [8];
  pair<long,_wallet::CWalletTx_*> local_50;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_50.second = (CWalletTx *)local_58;
  local_58 = (undefined1  [8])0x0;
  local_50.first = (long)&local_59;
  local_59 = 0;
  local_40 = (_Base_ptr)hash;
  pVar7 = std::
          _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256_const&>,std::tuple<decltype(nullptr)&&,wallet::TxStateInactive&&>>
                    ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->mapWallet,&std::piecewise_construct,&local_40,&local_50);
  _Var3 = pVar7.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
          _M_cur;
  local_50.first = CONCAT71(local_50.first._1_7_,pVar7.second) & 0xffffffffffffff01;
  if ((fill_wtx->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_function_call();
    }
  }
  else {
    this_00 = (CWalletTx *)
              ((long)_Var3.
                     super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                     _M_cur + 0x28);
    bVar2 = (*fill_wtx->_M_invoker)((_Any_data *)fill_wtx,this_00,(bool *)&local_50);
    if (bVar2) {
      if (this->m_chain != (Chain *)0x0) {
        CWalletTx::updateState(this_00,this->m_chain);
      }
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_50.first =
             *(ulong *)((long)_Var3.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x80);
        local_50.second = this_00;
        iVar4 = std::
                _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                ::_M_emplace_equal<std::pair<long,wallet::CWalletTx*>>
                          ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                            *)&this->wtxOrdered,&local_50);
        *(_Base_ptr *)
         ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x88) = iVar4._M_node;
      }
      AddToSpends(this,this_00,(WalletBatch *)0x0);
      pkVar1 = (key_type *)
               (*(undefined8 **)
                 ((long)_Var3.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1c0))[1];
      for (__k = (uchar *)**(undefined8 **)
                            ((long)_Var3.
                                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                   ._M_cur + 0x1c0); (key_type *)__k != pkVar1; __k = __k + 0x68) {
        iVar5 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->mapWallet)._M_h,(key_type *)__k);
        if ((iVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
             _M_cur != (__node_type *)0x0) &&
           (*(char *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                            ._M_cur + 0x1f8) == '\x02')) {
          MarkConflicted(this,(uint256 *)
                              ((long)iVar5.
                                     super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                     ._M_cur + 0x1d0),
                         *(int *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                        ._M_cur + 0x1f0),
                         (uint256 *)
                         (*(long *)((long)_Var3.
                                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                          ._M_cur + 0x1c0) + 0x39));
        }
      }
      iVar6 = CWalletTx::GetTxTime(this_00);
      if (iVar6 < (this->m_birth_time).super___atomic_base<long>._M_i) {
        LOCK();
        (this->m_birth_time).super___atomic_base<long>._M_i = iVar6;
        UNLOCK();
      }
    }
    if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::LoadToWallet(const uint256& hash, const UpdateWalletTxFn& fill_wtx)
{
    const auto& ins = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(nullptr, TxStateInactive{}));
    CWalletTx& wtx = ins.first->second;
    if (!fill_wtx(wtx, ins.second)) {
        return false;
    }
    // If wallet doesn't have a chain (e.g when using bitcoin-wallet tool),
    // don't bother to update txn.
    if (HaveChain()) {
      wtx.updateState(chain());
    }
    if (/* insertion took place */ ins.second) {
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
    }
    AddToSpends(wtx);
    for (const CTxIn& txin : wtx.tx->vin) {
        auto it = mapWallet.find(txin.prevout.hash);
        if (it != mapWallet.end()) {
            CWalletTx& prevtx = it->second;
            if (auto* prev = prevtx.state<TxStateBlockConflicted>()) {
                MarkConflicted(prev->conflicting_block_hash, prev->conflicting_block_height, wtx.GetHash());
            }
        }
    }

    // Update birth time when tx time is older than it.
    MaybeUpdateBirthTime(wtx.GetTxTime());

    return true;
}